

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O1

void __thiscall
Assimp::ZipArchiveIOSystem::Implement::getFileListExtension
          (Implement *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rFileList,string *extension)

{
  size_t __n;
  int iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  string local_50;
  
  MapArchive(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(rFileList);
  p_Var2 = (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      BaseImporter::GetExtension(&local_50,(string *)(p_Var2 + 1));
      __n = extension->_M_string_length;
      if (__n == local_50._M_string_length) {
        if (__n == 0) {
          bVar4 = true;
        }
        else {
          iVar1 = bcmp((extension->_M_dataplus)._M_p,local_50._M_dataplus._M_p,__n);
          bVar4 = iVar1 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (bVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(rFileList,(value_type *)(p_Var2 + 1));
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::getFileListExtension(std::vector<std::string>& rFileList, const std::string& extension) {
        MapArchive();
        rFileList.clear();

        for (const auto &file : m_ArchiveMap) {
            if (extension == BaseImporter::GetExtension(file.first))
                rFileList.push_back(file.first);
        }
    }